

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O1

void pzshape::TPZShapePrism::ShapeGenerating
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  int64_t *piVar1;
  double **ppdVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int node;
  long lVar10;
  ulong uVar11;
  double dVar12;
  TPZStack<int,_10> highsides;
  long local_80;
  TPZManVector<int,_10> local_78;
  
  piVar1 = &(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  ppdVar2 = &dphi->fElem;
  lVar10 = 6;
  local_80 = 0x30;
  do {
    iVar5 = (int)lVar10;
    iVar3 = pztopology::TPZPrism::NSideNodes(iVar5);
    switch(iVar3) {
    case 2:
      iVar3 = pztopology::TPZPrism::SideNodeLocId(iVar5,0);
      node = 1;
      goto LAB_00fe8772;
    case 3:
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 4) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = (ulong)(lVar10 == 0x13) * 3 + 2;
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[lVar10] =
           (*phi->fElem + phi->fElem[3]) * (phi->fElem[1] + phi->fElem[4]) * phi->fElem[lVar9];
      lVar8 = 0;
      do {
        if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 4) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar6 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar6 <= lVar8) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 4) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar7 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar7 <= lVar8) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)
           ) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)
         ((long)dphi->fElem +
         lVar8 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * local_80) =
             (*phi->fElem + phi->fElem[3]) * (phi->fElem[1] + phi->fElem[4]) *
             dphi->fElem[lVar7 * lVar9 + lVar8] +
             (dphi->fElem[lVar8] +
             dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 3 + lVar8]) *
             (phi->fElem[1] + phi->fElem[4]) * phi->fElem[lVar9] +
             (*phi->fElem + phi->fElem[3]) *
             (dphi->fElem[lVar6 + lVar8] +
             dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 4 + lVar8]) *
             phi->fElem[lVar9];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      break;
    case 4:
      iVar3 = pztopology::TPZPrism::SideNodeLocId(iVar5,0);
      node = 2;
LAB_00fe8772:
      iVar5 = pztopology::TPZPrism::SideNodeLocId(iVar5,node);
      lVar9 = (long)iVar3;
      if (((iVar3 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar6 = (long)iVar5;
      if (((iVar5 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[lVar10] = phi->fElem[lVar9] * phi->fElem[lVar6];
      if (((*piVar1 < 1) || (iVar3 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar5 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar3 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((*piVar1 < 1) || (iVar5 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar8 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar7 = *piVar1;
      (*ppdVar2)[lVar7 * lVar10] =
           (*ppdVar2)[*piVar1 * lVar9] * phi->fElem[lVar6] +
           phi->fElem[lVar9] * dphi->fElem[lVar8 * lVar6];
      if (((lVar7 < 2) || (iVar3 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar5 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar3 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((*piVar1 < 2) || (iVar5 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar8 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar7 = *piVar1;
      (*ppdVar2)[lVar7 * lVar10 + 1] =
           (*ppdVar2)[*piVar1 * lVar9 + 1] * phi->fElem[lVar6] +
           phi->fElem[lVar9] * dphi->fElem[lVar8 * lVar6 + 1];
      if (((lVar7 < 3) || (iVar3 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar5 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar3 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((*piVar1 < 3) || (iVar5 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dVar12 = (*ppdVar2)[*piVar1 * lVar9 + 2] * phi->fElem[lVar6] +
               phi->fElem[lVar9] * dphi->fElem[lVar6 * lVar8 + 2];
joined_r0x00fe9d82:
      if ((lVar8 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      (*ppdVar2)[*piVar1 * lVar10 + 2] = dVar12;
      break;
    case 6:
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 6) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[lVar10] = *phi->fElem * phi->fElem[4] * (phi->fElem[2] + phi->fElem[5]);
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 6) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 6) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar9 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar8 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar6 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dphi->fElem[lVar6 * lVar10] =
           *phi->fElem * phi->fElem[4] * (dphi->fElem[lVar9 * 2] + dphi->fElem[lVar8 * 5]) +
           **ppdVar2 * phi->fElem[4] * (phi->fElem[2] + phi->fElem[5]) +
           *phi->fElem * (*ppdVar2)[*piVar1 * 4] * (phi->fElem[2] + phi->fElem[5]);
      if ((lVar6 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 6) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 6) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar9 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar8 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar6 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dphi->fElem[lVar6 * lVar10 + 1] =
           *phi->fElem * phi->fElem[4] * (dphi->fElem[lVar9 * 2 + 1] + dphi->fElem[lVar8 * 5 + 1]) +
           (*ppdVar2)[1] * phi->fElem[4] * (phi->fElem[2] + phi->fElem[5]) +
           *phi->fElem * (*ppdVar2)[*piVar1 * 4 + 1] * (phi->fElem[2] + phi->fElem[5]);
      if ((lVar6 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 6) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 6) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 5) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar9 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dVar12 = *phi->fElem * phi->fElem[4] *
               (dphi->fElem[lVar9 * 2 + 2] + dphi->fElem[lVar8 * 5 + 2]) +
               (*ppdVar2)[2] * phi->fElem[4] * (phi->fElem[2] + phi->fElem[5]) +
               *phi->fElem * (*ppdVar2)[*piVar1 * 4 + 2] * (phi->fElem[2] + phi->fElem[5]);
      goto joined_r0x00fe9d82;
    }
    lVar10 = lVar10 + 1;
    local_80 = local_80 + 8;
    if (lVar10 == 0x15) {
      lVar10 = 6;
      do {
        TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
        pztopology::TPZPrism::HigherDimensionSides((int)lVar10,(TPZStack<int,_10> *)&local_78);
        uVar4 = (uint)local_78.super_TPZVec<int>.fNElements;
        if (0 < (int)uVar4) {
          uVar11 = 0;
          do {
            iVar3 = local_78.super_TPZVec<int>.fStore[uVar11];
            iVar5 = pztopology::TPZPrism::NSideNodes(iVar3);
            if (iVar5 == 4) {
              lVar9 = (long)iVar3;
              if (((iVar3 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)
                  ) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
                 ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              phi->fElem[lVar10] = phi->fElem[lVar9] + phi->fElem[lVar10];
              if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) || (iVar3 < 0)) ||
                 ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              if ((lVar8 < 1) ||
                 ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar6 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              lVar7 = lVar6 * lVar10;
              dphi->fElem[lVar7] = dphi->fElem[lVar8 * lVar9] + dphi->fElem[lVar7];
              if (((lVar6 < 2) || (iVar3 < 0)) ||
                 ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              if ((lVar8 < 2) ||
                 ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar6 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              lVar7 = lVar6 * lVar10;
              dphi->fElem[lVar7 + 1] = dphi->fElem[lVar8 * lVar9 + 1] + dphi->fElem[lVar7 + 1];
              if (((lVar6 < 3) || (iVar3 < 0)) ||
                 ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              if ((lVar8 < 3) ||
                 ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar6 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar10;
              dphi->fElem[lVar6 + 2] = dphi->fElem[lVar9 * lVar8 + 2] + dphi->fElem[lVar6 + 2];
            }
            uVar11 = uVar11 + 1;
          } while ((uVar4 & 0x7fffffff) != uVar11);
        }
        TPZManVector<int,_10>::~TPZManVector(&local_78);
        lVar10 = lVar10 + 1;
        if (lVar10 == 0x15) {
          lVar10 = 6;
          while( true ) {
            dVar12 = *(double *)(&DAT_0154d410 + lVar10 * 8);
            if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
               ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            phi->fElem[lVar10] = phi->fElem[lVar10] * dVar12;
            if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            lVar8 = lVar9 * lVar10;
            dphi->fElem[lVar8] = dphi->fElem[lVar8] * dVar12;
            if ((lVar9 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10))
            {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            lVar8 = lVar9 * lVar10;
            dphi->fElem[lVar8 + 1] = dphi->fElem[lVar8 + 1] * dVar12;
            if ((lVar9 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10))
            break;
            lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar10;
            dphi->fElem[lVar9 + 2] = dVar12 * dphi->fElem[lVar9 + 2];
            lVar10 = lVar10 + 1;
            if (lVar10 == 0x15) {
              return;
            }
          }
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void TPZShapePrism::ShapeGenerating(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
	{
		int is;
		// 9 ribs
		for(is=6; is<NSides; is++)
		{
			int nsnodes = NSideNodes(is);
			switch(nsnodes)
			{
				case 2:
				{
					int is1 = SideNodeLocId(is,0);
					int is2 = SideNodeLocId(is,1);
					phi(is,0) = phi(is1,0)*phi(is2,0);
					dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
					dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
					dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
				}
					break;
				case 3:
				{
					int is0 = 0;
					int is1 = 1;
					int is2 = 2;
					int is3 = 3;
					int is4 = 4;
					if(is == 19)
					{
						is2 = 5;
					}
					phi(is,0) = (phi(is0,0)+phi(is3,0))*(phi(is1,0)+phi(is4,0))*phi(is2,0);
					int d;
					for(d=0; d<3; d++)
					{
						dphi(d,is) = 
						(dphi(d,is0)+dphi(d,is3))*(phi(is1,0)+phi(is4,0))*phi(is2,0) +
						(phi(is0,0)+phi(is3,0))*(dphi(d,is1)+dphi(d,is4))*phi(is2,0) +
						(phi(is0,0)+phi(is3,0))*(phi(is1,0)+phi(is4,0))*dphi(d,is2);
					}
				}
					break;
				case 4:
				{
					int is1 = SideNodeLocId(is,0);
					int is2 = SideNodeLocId(is,2);
					phi(is,0) = phi(is1,0)*phi(is2,0);
					dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
					dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
					dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
				}
					break;
				case 6:
				{
					int is1 = 0;
					int is2 = 4;
					int is3 = 2;
					int is4 = 5;
					phi(is,0) = phi(is1,0)*phi(is2,0)*(phi(is3,0)+phi(is4,0));
					dphi(0,is) = dphi(0,is1)*phi(is2,0)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*dphi(0,is2)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*phi(is2,0)*(dphi(0,is3)+dphi(0,is4));
					dphi(1,is) = dphi(1,is1)*phi(is2,0)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*dphi(1,is2)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*phi(is2,0)*(dphi(1,is3)+dphi(1,is4));
					dphi(2,is) = dphi(2,is1)*phi(is2,0)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*dphi(2,is2)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*phi(is2,0)*(dphi(2,is3)+dphi(2,is4));
				}
					break;
				default:
					;
			}
		}
		// Make the generating shape functions linear and unitary
		for(is=6; is<NSides; is++)
		{
			TPZStack<int> highsides;
			HigherDimensionSides(is,highsides);
			int h, nh = highsides.NElements();
			for(h=0; h<nh; h++)
			{
				int hs = highsides[h];
				if(NSideNodes(hs) != 4) continue;
				phi(is,0) += phi(hs,0);
				dphi(0,is) += dphi(0,hs);
				dphi(1,is) += dphi(1,hs);
				dphi(2,is) += dphi(2,hs);
			}
		}
		REAL mult[] = {1.,1.,1.,1.,1.,1.,4.,4.,4.,4.,4.,4.,4.,4.,4.,27.,16.,16.,16.,27.,8.};
		for(is=6;is<NSides; is++)
		{
			phi(is,0) *= mult[is];
			dphi(0,is) *= mult[is];
			dphi(1,is) *= mult[is];
			dphi(2,is) *= mult[is];
		}
		
	}